

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::SetContentFormat
          (Error *__return_storage_ptr__,Message *this,ContentFormat aContentFormat)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  OptionValue::OptionValue((OptionValue *)&local_30,aContentFormat);
  AppendOption(__return_storage_ptr__,this,kContentFormat,(OptionValue *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Error SetContentFormat(ContentFormat aContentFormat)
    {
        return AppendOption(OptionType::kContentFormat, OptionValue{utils::to_underlying(aContentFormat)});
    }